

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

int Gia_LutWhereIsPin(Gia_Man_t *p,int iFanout,int iFanin,int *pPinPerm)

{
  int iVar1;
  int local_2c;
  int i;
  int *pPinPerm_local;
  int iFanin_local;
  int iFanout_local;
  Gia_Man_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ObjLutSize(p,iFanout);
    if (iVar1 <= local_2c) {
      return -1;
    }
    iVar1 = Gia_ObjLutFanin(p,iFanout,pPinPerm[local_2c]);
    if (iVar1 == iFanin) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Gia_LutWhereIsPin( Gia_Man_t * p, int iFanout, int iFanin, int * pPinPerm )
{
    int i;
    for ( i = 0; i < Gia_ObjLutSize(p, iFanout); i++ )
        if ( Gia_ObjLutFanin(p, iFanout, pPinPerm[i]) == iFanin )
            return i;
    return -1;
}